

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_create_load_balancer_ht_tp_slistener.cc
# Opt level: O2

int __thiscall
aliyun::Slb::CreateLoadBalancerHTTPSListener
          (Slb *this,SlbCreateLoadBalancerHTTPSListenerRequestType *req,
          SlbCreateLoadBalancerHTTPSListenerResponseType *response,SlbErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f3;
  allocator<char> local_8f2;
  allocator<char> local_8f1;
  Value val;
  string str_response;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,this->version_,(allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,this->secret_,&local_919);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_178,&local_198,&local_1b8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,pcVar4,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Action",(allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"CreateLoadBalancerHTTPSListener",&local_919);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"OwnerId",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_278,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_258,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"ResourceOwnerAccount",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_2b8,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_298,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"ResourceOwnerId",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_2f8,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2d8,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"LoadBalancerId",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_338,(string *)&req->load_balancer_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_318,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_318);
  }
  if ((req->bandwidth)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"Bandwidth",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_378,(string *)&req->bandwidth);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_358,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_358);
  }
  if ((req->listener_port)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"ListenerPort",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_3b8,(string *)&req->listener_port);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_398,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_398);
  }
  if ((req->backend_server_port)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"BackendServerPort",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_3f8,(string *)&req->backend_server_port);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3d8,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  if ((req->xforwarded_for)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"XForwardedFor",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_438,(string *)&req->xforwarded_for);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_418,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
  }
  if ((req->scheduler)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"Scheduler",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_478,(string *)&req->scheduler);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_458,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
  }
  if ((req->sticky_session)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,"StickySession",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_4b8,(string *)&req->sticky_session);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_498,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_498);
  }
  if ((req->sticky_session_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"StickySessionType",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_4f8,(string *)&req->sticky_session_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4d8,&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_4d8);
  }
  if ((req->cookie_timeout)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"CookieTimeout",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_538,(string *)&req->cookie_timeout);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_518,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_518);
  }
  if ((req->cookie)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"Cookie",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_578,(string *)&req->cookie);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_558,&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_558);
  }
  if ((req->health_check)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"HealthCheck",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_5b8,(string *)&req->health_check);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_598,&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_598);
  }
  if ((req->health_check_domain)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"HealthCheckDomain",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_5f8,(string *)&req->health_check_domain);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5d8,&local_5f8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5d8);
  }
  if ((req->health_check_ur_i)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_618,"HealthCheckURI",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_638,(string *)&req->health_check_ur_i);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_618,&local_638);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_618);
  }
  if ((req->healthy_threshold)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_658,"HealthyThreshold",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_678,(string *)&req->healthy_threshold);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_658,&local_678);
    std::__cxx11::string::~string((string *)&local_678);
    std::__cxx11::string::~string((string *)&local_658);
  }
  if ((req->unhealthy_threshold)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"UnhealthyThreshold",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_6b8,(string *)&req->unhealthy_threshold);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_698,&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::__cxx11::string::~string((string *)&local_698);
  }
  if ((req->health_check_timeout)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"HealthCheckTimeout",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_6f8,(string *)&req->health_check_timeout);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6d8,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::__cxx11::string::~string((string *)&local_6d8);
  }
  if ((req->health_check_connect_port)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_718,"HealthCheckConnectPort",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_738,(string *)&req->health_check_connect_port);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_718,&local_738);
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_718);
  }
  if ((req->health_check_interval)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_758,"HealthCheckInterval",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_778,(string *)&req->health_check_interval);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_758,&local_778);
    std::__cxx11::string::~string((string *)&local_778);
    std::__cxx11::string::~string((string *)&local_758);
  }
  if ((req->health_check_http_code)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_798,"HealthCheckHttpCode",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_7b8,(string *)&req->health_check_http_code);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_798,&local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::__cxx11::string::~string((string *)&local_798);
  }
  if ((req->server_certificate_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"ServerCertificateId",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_7f8,(string *)&req->server_certificate_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7d8,&local_7f8);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_7d8);
  }
  if ((req->max_conn_limit)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_818,"MaxConnLimit",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_838,(string *)&req->max_conn_limit);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_818,&local_838);
    std::__cxx11::string::~string((string *)&local_838);
    std::__cxx11::string::~string((string *)&local_818);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_858,"OwnerAccount",(allocator<char> *)&local_918);
    std::__cxx11::string::string((string *)&local_878,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_858,&local_878);
    std::__cxx11::string::~string((string *)&local_878);
    std::__cxx11::string::~string((string *)&local_858);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_898,"RegionId",(allocator<char> *)&local_918);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,this->region_id_,&local_919);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_898,&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_898);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_918,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_918,anon_var_dwarf_169eda + 9,&local_919);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_918);
        std::__cxx11::string::~string((string *)&local_918);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_918,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_918,anon_var_dwarf_169eda + 9,&local_8f1);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_918);
        std::__cxx11::string::~string((string *)&local_918);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_918,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_918,anon_var_dwarf_169eda + 9,&local_8f2);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_918);
        std::__cxx11::string::~string((string *)&local_918);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_918,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_918,anon_var_dwarf_169eda + 9,&local_8f3);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_918);
        std::__cxx11::string::~string((string *)&local_918);
      }
      goto LAB_00134415;
    }
  }
  iVar2 = -1;
  if (error_info != (SlbErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00134415:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Slb::CreateLoadBalancerHTTPSListener(const SlbCreateLoadBalancerHTTPSListenerRequestType& req,
                      SlbCreateLoadBalancerHTTPSListenerResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","CreateLoadBalancerHTTPSListener");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.bandwidth.empty()) {
    req_rpc->AddRequestQuery("Bandwidth", req.bandwidth);
  }
  if(!req.listener_port.empty()) {
    req_rpc->AddRequestQuery("ListenerPort", req.listener_port);
  }
  if(!req.backend_server_port.empty()) {
    req_rpc->AddRequestQuery("BackendServerPort", req.backend_server_port);
  }
  if(!req.xforwarded_for.empty()) {
    req_rpc->AddRequestQuery("XForwardedFor", req.xforwarded_for);
  }
  if(!req.scheduler.empty()) {
    req_rpc->AddRequestQuery("Scheduler", req.scheduler);
  }
  if(!req.sticky_session.empty()) {
    req_rpc->AddRequestQuery("StickySession", req.sticky_session);
  }
  if(!req.sticky_session_type.empty()) {
    req_rpc->AddRequestQuery("StickySessionType", req.sticky_session_type);
  }
  if(!req.cookie_timeout.empty()) {
    req_rpc->AddRequestQuery("CookieTimeout", req.cookie_timeout);
  }
  if(!req.cookie.empty()) {
    req_rpc->AddRequestQuery("Cookie", req.cookie);
  }
  if(!req.health_check.empty()) {
    req_rpc->AddRequestQuery("HealthCheck", req.health_check);
  }
  if(!req.health_check_domain.empty()) {
    req_rpc->AddRequestQuery("HealthCheckDomain", req.health_check_domain);
  }
  if(!req.health_check_ur_i.empty()) {
    req_rpc->AddRequestQuery("HealthCheckURI", req.health_check_ur_i);
  }
  if(!req.healthy_threshold.empty()) {
    req_rpc->AddRequestQuery("HealthyThreshold", req.healthy_threshold);
  }
  if(!req.unhealthy_threshold.empty()) {
    req_rpc->AddRequestQuery("UnhealthyThreshold", req.unhealthy_threshold);
  }
  if(!req.health_check_timeout.empty()) {
    req_rpc->AddRequestQuery("HealthCheckTimeout", req.health_check_timeout);
  }
  if(!req.health_check_connect_port.empty()) {
    req_rpc->AddRequestQuery("HealthCheckConnectPort", req.health_check_connect_port);
  }
  if(!req.health_check_interval.empty()) {
    req_rpc->AddRequestQuery("HealthCheckInterval", req.health_check_interval);
  }
  if(!req.health_check_http_code.empty()) {
    req_rpc->AddRequestQuery("HealthCheckHttpCode", req.health_check_http_code);
  }
  if(!req.server_certificate_id.empty()) {
    req_rpc->AddRequestQuery("ServerCertificateId", req.server_certificate_id);
  }
  if(!req.max_conn_limit.empty()) {
    req_rpc->AddRequestQuery("MaxConnLimit", req.max_conn_limit);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}